

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lysc_ext_instance * lyd_get_meta_annotation(lys_module *mod,char *name,size_t name_len)

{
  lysc_ext_instance *plVar1;
  undefined8 *puVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  
  if (mod != (lys_module *)0x0) {
    lVar5 = 0;
    pvVar6 = (void *)0x0;
    while( true ) {
      plVar1 = mod->compiled->exts;
      if (plVar1 == (lysc_ext_instance *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = plVar1[-1].compiled;
      }
      if (pvVar4 <= pvVar6) break;
      puVar2 = *(undefined8 **)(*(long *)((long)&plVar1->def + lVar5) + 0x18);
      if (((puVar2 != (undefined8 *)0x0) &&
          (iVar3 = strncmp((char *)*puVar2,"ly2 metadata",0xc), iVar3 == 0)) &&
         (iVar3 = ly_strncmp(*(char **)((long)&plVar1->argument + lVar5),name,name_len), iVar3 == 0)
         ) {
        return (lysc_ext_instance *)((long)&mod->compiled->exts->def + lVar5);
      }
      pvVar6 = (void *)((long)pvVar6 + 1);
      lVar5 = lVar5 + 0x48;
    }
  }
  return (lysc_ext_instance *)0x0;
}

Assistant:

static struct lysc_ext_instance *
lyd_get_meta_annotation(const struct lys_module *mod, const char *name, size_t name_len)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyplg_ext *plugin;

    if (!mod) {
        return NULL;
    }

    LY_ARRAY_FOR(mod->compiled->exts, u) {
        plugin = mod->compiled->exts[u].def->plugin;
        if (plugin && !strncmp(plugin->id, "ly2 metadata", 12) &&
                !ly_strncmp(mod->compiled->exts[u].argument, name, name_len)) {
            return &mod->compiled->exts[u];
        }
    }

    return NULL;
}